

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O0

FT_Error cff_get_glyph_data(TT_Face face,FT_UInt glyph_index,FT_Byte **pointer,FT_ULong *length)

{
  CFF_Font_conflict cff;
  undefined1 auStack_40 [4];
  FT_Error error;
  FT_Data data;
  FT_ULong *length_local;
  FT_Byte **pointer_local;
  FT_UInt glyph_index_local;
  TT_Face face_local;
  
  data._8_8_ = length;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    face_local._4_4_ =
         cff_index_access_element
                   ((CFF_Index)((long)(face->extra).data + 0x538),glyph_index,pointer,length);
  }
  else {
    face_local._4_4_ =
         (*((face->root).internal)->incremental_interface->funcs->get_glyph_data)
                   (((face->root).internal)->incremental_interface->object,glyph_index,
                    (FT_Data *)auStack_40);
    *pointer = _auStack_40;
    *(long *)data._8_8_ = (long)(int)data.pointer;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_get_glyph_data( TT_Face    face,
                      FT_UInt    glyph_index,
                      FT_Byte**  pointer,
                      FT_ULong*  length )
  {
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( face->root.internal->incremental_interface )
    {
      FT_Data   data;
      FT_Error  error =
                  face->root.internal->incremental_interface->funcs->get_glyph_data(
                    face->root.internal->incremental_interface->object,
                    glyph_index, &data );


      *pointer = (FT_Byte*)data.pointer;
      *length  = (FT_ULong)data.length;

      return error;
    }
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    {
      CFF_Font  cff = (CFF_Font)(face->extra.data);


      return cff_index_access_element( &cff->charstrings_index, glyph_index,
                                       pointer, length );
    }
  }